

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

bool helics::CoreFactory::registerCore(shared_ptr<helics::Core> *core,CoreType type)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  shared_ptr<helics::Core> local_60;
  shared_ptr<helics::Core> local_50;
  string local_40;
  
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  else {
    iVar4 = (*peVar1->_vptr_Core[0xc])();
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
    peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      bVar3 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addObject
                        ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
                         &local_40,&local_50,type);
      if (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (bVar3) {
        local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )->_M_use_count =
                 (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )->_M_use_count =
                 (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        gmlc::concurrency::DelayedDestructor<helics::Core>::addObjectsToBeDestroyed
                  ((DelayedDestructor<helics::Core> *)delayedDestroyer,&local_60);
        if (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        bVar3 = true;
        addExtraTypes(&local_40,type);
        goto LAB_002dd45a;
      }
    }
  }
  bVar3 = false;
LAB_002dd45a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool registerCore(const std::shared_ptr<Core>& core, CoreType type)
{
    bool res = false;
    const std::string& cname = (core) ? core->getIdentifier() : std::string{};
    if (core) {
        res = searchableCores.addObject(cname, core, type);
    }
    if (res) {
        delayedDestroyer.addObjectsToBeDestroyed(core);
        addExtraTypes(cname, type);
    }
    return res;
}